

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void av1_zero_above_context
               (AV1_COMMON *cm,MACROBLOCKD *xd,int mi_col_start,int mi_col_end,int tile_row)

{
  uint8_t uVar1;
  byte bVar2;
  SequenceHeader *pSVar3;
  ENTROPY_CONTEXT *pEVar4;
  int iVar5;
  ulong uVar6;
  size_t __n;
  
  pSVar3 = cm->seq_params;
  uVar1 = pSVar3->monochrome;
  uVar6 = -1L << ((byte)pSVar3->mib_size_log2 & 0x3f);
  bVar2 = (byte)pSVar3->subsampling_x;
  uVar6 = (long)(int)(~(uint)uVar6 + (mi_col_end - mi_col_start)) & uVar6;
  iVar5 = mi_col_start >> (bVar2 & 0x1f);
  memset((cm->above_contexts).entropy[0][tile_row] + mi_col_start,0,uVar6);
  if (uVar1 == '\0') {
    pEVar4 = (cm->above_contexts).entropy[1][tile_row];
    if ((pEVar4 == (ENTROPY_CONTEXT *)0x0) ||
       ((cm->above_contexts).entropy[2][tile_row] == (ENTROPY_CONTEXT *)0x0)) {
      aom_internal_error(xd->error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid value of planes");
    }
    else {
      __n = (size_t)((int)uVar6 >> (bVar2 & 0x1f));
      memset(pEVar4 + iVar5,0,__n);
      memset((cm->above_contexts).entropy[2][tile_row] + iVar5,0,__n);
    }
  }
  memset((cm->above_contexts).partition[tile_row] + mi_col_start,0,uVar6);
  memset((cm->above_contexts).txfm[tile_row] + mi_col_start,0x40,uVar6);
  return;
}

Assistant:

static inline void av1_zero_above_context(AV1_COMMON *const cm,
                                          const MACROBLOCKD *xd,
                                          int mi_col_start, int mi_col_end,
                                          const int tile_row) {
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  const int width = mi_col_end - mi_col_start;
  const int aligned_width =
      ALIGN_POWER_OF_TWO(width, seq_params->mib_size_log2);
  const int offset_y = mi_col_start;
  const int width_y = aligned_width;
  const int offset_uv = offset_y >> seq_params->subsampling_x;
  const int width_uv = width_y >> seq_params->subsampling_x;
  CommonContexts *const above_contexts = &cm->above_contexts;

  av1_zero_array(above_contexts->entropy[0][tile_row] + offset_y, width_y);
  if (num_planes > 1) {
    if (above_contexts->entropy[1][tile_row] &&
        above_contexts->entropy[2][tile_row]) {
      av1_zero_array(above_contexts->entropy[1][tile_row] + offset_uv,
                     width_uv);
      av1_zero_array(above_contexts->entropy[2][tile_row] + offset_uv,
                     width_uv);
    } else {
      aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid value of planes");
    }
  }

  av1_zero_array(above_contexts->partition[tile_row] + mi_col_start,
                 aligned_width);

  memset(above_contexts->txfm[tile_row] + mi_col_start,
         tx_size_wide[TX_SIZES_LARGEST], aligned_width * sizeof(TXFM_CONTEXT));
}